

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

Result __thiscall testing::Action<unsigned_int_()>::Perform(Action<unsigned_int_()> *this)

{
  uint uVar1;
  
  if ((this->fun_).super__Function_base._M_manager == (_Manager_type)0x0) {
    testing::internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googlemock/include/gmock/gmock-actions.h"
               ,0x1f0);
  }
  uVar1 = std::function<unsigned_int_()>::operator()(&this->fun_);
  return uVar1;
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
    return internal::Apply(fun_, ::std::move(args));
  }